

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_scene.cpp
# Opt level: O1

void __thiscall FGLRenderer::DrawBlend(FGLRenderer *this,sector_t *viewsector)

{
  extsector_t *peVar1;
  lightlist_t *plVar2;
  long lVar3;
  sector_t *psVar4;
  uint uVar5;
  long lVar6;
  undefined8 *puVar7;
  long *plVar8;
  player_t *CPlayer;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  double *pdVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  double dVar19;
  float blend [4];
  float local_38 [6];
  
  local_38[0] = 0.0;
  local_38[1] = 0.0;
  local_38[2] = 0.0;
  local_38[3] = 0.0;
  if ((&DAT_00a39408)[(long)consoleplayer * 0x54] == 0) {
LAB_0044b756:
    CPlayer = (player_t *)0x0;
  }
  else {
    if ((*(byte *)((&DAT_00a39408)[(long)consoleplayer * 0x54] + 0x20) & 0x20) != 0) {
      (&DAT_00a39408)[(long)consoleplayer * 0x54] = 0;
      goto LAB_0044b756;
    }
    CPlayer = *(player_t **)((&DAT_00a39408)[(long)consoleplayer * 0x54] + 0x200);
  }
  if (gl_fixedcolormap != 0) goto LAB_0044b761;
  peVar1 = viewsector->e;
  if ((peVar1->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count == 0) {
    psVar4 = viewsector->heightsec;
    if ((psVar4 == (sector_t *)0x0) || ((viewsector->MoreFlags & 0x10) != 0)) goto LAB_0044b8f7;
    if (in_area == area_below) {
      uVar14 = (ulong)psVar4->bottommap;
    }
    else if (in_area == area_above) {
      uVar14 = (ulong)psVar4->topmap;
    }
    else {
      uVar14 = (ulong)psVar4->midmap;
    }
    uVar5 = (uint)uVar14;
    uVar9 = uVar5 >> 8;
    uVar10 = uVar5 >> 0x10;
    uVar11 = (uint)(uVar14 >> 0x18);
  }
  else {
    uVar5 = (peVar1->XFloor).lightlist.Count;
    if ((ulong)uVar5 != 0) {
      lVar6 = 0x70;
      uVar14 = 0;
      do {
        if (uVar14 < uVar5 - 1) {
          plVar2 = (peVar1->XFloor).lightlist.Array;
          dVar19 = *(double *)((long)plVar2 + lVar6 + -0x18) * ViewPos.Y +
                   *(double *)((long)plVar2 + lVar6 + -0x20) * ViewPos.X +
                   *(double *)((long)plVar2 + lVar6 + -8);
          pdVar15 = (double *)((long)&(plVar2->plane).normal.X + lVar6);
        }
        else {
          dVar19 = (viewsector->floorplane).normal.Y * ViewPos.Y +
                   (viewsector->floorplane).normal.X * ViewPos.X + (viewsector->floorplane).D;
          pdVar15 = &(viewsector->floorplane).negiC;
        }
        if (dVar19 * *pdVar15 < ViewPos.Z) {
          plVar2 = (peVar1->XFloor).lightlist.Array;
          lVar3 = *(long *)((long)plVar2 + lVar6 + -0x28);
          if ((lVar3 == 0) || ((*(byte *)(lVar3 + 0x5b) & 8) == 0)) {
            uVar5 = *(uint *)((long)plVar2 + lVar6 + -0x38);
            if (uVar5 == (viewsector->ColorMap->Fade).field_0.d) {
              uVar5 = 0;
              uVar9 = 0;
              uVar10 = 0;
              uVar12 = 0;
            }
            else {
              uVar9 = uVar5 >> 8;
              uVar10 = uVar5 >> 0x10;
              uVar12 = uVar5 >> 0x18;
            }
            uVar11 = uVar12;
            if (((char)uVar12 == '\0') &&
               (uVar11 = 0x80, (uVar5 & 0xff) == 0 && ((uVar9 & 0xff) == 0 && (uVar10 & 0xff) == 0))
               ) {
              uVar11 = uVar12;
            }
            goto LAB_0044b900;
          }
        }
        uVar14 = uVar14 + 1;
        lVar6 = lVar6 + 0x50;
      } while (uVar5 != uVar14);
    }
LAB_0044b8f7:
    uVar5 = 0;
    uVar9 = 0;
    uVar10 = 0;
    uVar11 = 0;
  }
LAB_0044b900:
  if ((char)uVar11 == '\0') {
    uVar5 = R_BlendForColormap(uVar5 & 0xff | (uVar9 & 0xff) << 8 | (uVar10 & 0xff) << 0x10);
    uVar9 = uVar5 >> 8;
    uVar10 = uVar5 >> 0x10;
    uVar11 = uVar5 >> 0x18;
    if (uVar11 == 0xff) {
      uVar12 = this->framebuffer->palette_brightness;
      uVar10 = uVar10 & 0xff;
      if ((int)uVar12 <= (int)uVar10) {
        uVar12 = uVar10;
      }
      uVar9 = uVar9 & 0xff;
      uVar5 = uVar5 & 0xff;
      uVar13 = uVar5;
      if (uVar5 < uVar9) {
        uVar13 = uVar9;
      }
      if ((int)uVar13 < (int)uVar12) {
        uVar13 = uVar12;
      }
      uVar10 = (uVar10 * 0xff) / uVar13;
      uVar9 = (uVar9 * 0xff) / uVar13;
      uVar5 = (uVar5 * 0xff) / uVar13;
    }
  }
  if ((char)uVar11 != '\0') {
    if (uVar11 == 0xff) {
      fVar16 = (float)(uVar10 & 0xff) * 0.003921569;
      fVar17 = (float)(uVar9 & 0xff) * 0.003921569;
      fVar18 = (float)(uVar5 & 0xff) * 0.003921569;
      if (((fVar16 != 0.0) || (fVar17 != 0.0)) || (fVar18 != 0.0)) {
        if (gl_direct_state_change.Value == false) {
          gl_RenderState.mSrcBlend = 0x306;
          gl_RenderState.mDstBlend = 0;
        }
        else {
          (*_ptrc_glBlendFunc)(0x306,0);
        }
        gl_RenderState.mColor.vec[1] = fVar17;
        gl_RenderState.mColor.vec[0] = fVar16;
        gl_RenderState.mColor.vec[3] = 1.0;
        gl_RenderState.mColor.vec[2] = fVar18;
        gl_RenderState.mDesaturation = 0;
        gl_RenderState.mAlphaThreshold = -0.001;
        gl_RenderState.mTextureEnabled = false;
        FRenderState::Apply(&gl_RenderState);
        (*_ptrc_glDrawArrays)(5,4,4);
      }
    }
    else {
      V_AddBlend((float)(uVar10 & 0xff) * 0.003921569,(float)(uVar9 & 0xff) * 0.003921569,
                 (float)(uVar5 & 0xff) * 0.003921569,(float)uVar11 * 0.003921569,local_38);
    }
  }
LAB_0044b761:
  if (CPlayer != (player_t *)0x0) {
    V_AddPlayerBlend(CPlayer,local_38,0.5,0xaf);
  }
  lVar6 = (long)consoleplayer;
  if ((&DAT_00a39408)[lVar6 * 0x54] != 0) {
    plVar8 = &DAT_00a39408 + lVar6 * 0x54;
    if ((*(byte *)((&DAT_00a39408)[lVar6 * 0x54] + 0x20) & 0x20) == 0) {
      if (*(long *)(*plVar8 + 0x200) == 0) {
        puVar7 = &players + lVar6 * 0x54;
      }
      else {
        puVar7 = *(undefined8 **)(*plVar8 + 0x200);
      }
      V_AddBlend(*(float *)(puVar7 + 0x34),*(float *)((long)puVar7 + 0x1a4),
                 *(float *)(puVar7 + 0x35),*(float *)((long)puVar7 + 0x1ac),local_38);
    }
    else {
      *plVar8 = 0;
    }
  }
  if (gl_direct_state_change.Value == false) {
    gl_RenderState.mSrcBlend = 0x302;
    gl_RenderState.mDstBlend = 0x303;
  }
  else {
    (*_ptrc_glBlendFunc)(0x302,0x303);
  }
  if (0.0 < local_38[3]) {
    gl_RenderState.mColor.vec[0] = local_38[0];
    gl_RenderState.mColor.vec[1] = local_38[1];
    gl_RenderState.mColor.vec[2] = local_38[2];
    gl_RenderState.mColor.vec[3] = local_38[3];
    gl_RenderState.mDesaturation = 0;
    gl_RenderState.mAlphaThreshold = -0.001;
    gl_RenderState.mTextureEnabled = false;
    FRenderState::Apply(&gl_RenderState);
    (*_ptrc_glDrawArrays)(5,4,4);
  }
  gl_RenderState.mColor.vec[0] = 1.0;
  gl_RenderState.mColor.vec[1] = 1.0;
  gl_RenderState.mColor.vec[2] = 1.0;
  gl_RenderState.mColor.vec[3] = 1.0;
  gl_RenderState.mDesaturation = 0;
  gl_RenderState.mTextureEnabled = true;
  return;
}

Assistant:

void FGLRenderer::DrawBlend(sector_t * viewsector)
{
	float blend[4]={0,0,0,0};
	PalEntry blendv=0;
	float extra_red;
	float extra_green;
	float extra_blue;
	player_t *player = NULL;

	if (players[consoleplayer].camera != NULL)
	{
		player=players[consoleplayer].camera->player;
	}

	// don't draw sector based blends when an invulnerability colormap is active
	if (!gl_fixedcolormap)
	{
		if (!viewsector->e->XFloor.ffloors.Size())
		{
			if (viewsector->heightsec && !(viewsector->MoreFlags&SECF_IGNOREHEIGHTSEC))
			{
				switch (in_area)
				{
				default:
				case area_normal: blendv = viewsector->heightsec->midmap; break;
				case area_above: blendv = viewsector->heightsec->topmap; break;
				case area_below: blendv = viewsector->heightsec->bottommap; break;
				}
			}
		}
		else
		{
			TArray<lightlist_t> & lightlist = viewsector->e->XFloor.lightlist;

			for (unsigned int i = 0; i < lightlist.Size(); i++)
			{
				double lightbottom;
				if (i < lightlist.Size() - 1)
					lightbottom = lightlist[i + 1].plane.ZatPoint(ViewPos);
				else
					lightbottom = viewsector->floorplane.ZatPoint(ViewPos);

				if (lightbottom < ViewPos.Z && (!lightlist[i].caster || !(lightlist[i].caster->flags&FF_FADEWALLS)))
				{
					// 3d floor 'fog' is rendered as a blending value
					blendv = lightlist[i].blend;
					// If this is the same as the sector's it doesn't apply!
					if (blendv == viewsector->ColorMap->Fade) blendv = 0;
					// a little hack to make this work for Legacy maps.
					if (blendv.a == 0 && blendv != 0) blendv.a = 128;
					break;
				}
			}
		}

		if (blendv.a == 0)
		{
			blendv = R_BlendForColormap(blendv);
			if (blendv.a == 255)
			{
				// The calculated average is too dark so brighten it according to the palettes's overall brightness
				int maxcol = MAX<int>(MAX<int>(framebuffer->palette_brightness, blendv.r), MAX<int>(blendv.g, blendv.b));
				blendv.r = blendv.r * 255 / maxcol;
				blendv.g = blendv.g * 255 / maxcol;
				blendv.b = blendv.b * 255 / maxcol;
			}
		}

		if (blendv.a == 255)
		{

			extra_red = blendv.r / 255.0f;
			extra_green = blendv.g / 255.0f;
			extra_blue = blendv.b / 255.0f;

			// If this is a multiplicative blend do it separately and add the additive ones on top of it.
			blendv = 0;

			// black multiplicative blends are ignored
			if (extra_red || extra_green || extra_blue)
			{
				gl_RenderState.BlendFunc(GL_DST_COLOR, GL_ZERO);
				gl_RenderState.SetColor(extra_red, extra_green, extra_blue, 1.0f);
				gl_FillScreen();
			}
		}
		else if (blendv.a)
		{
			V_AddBlend(blendv.r / 255.f, blendv.g / 255.f, blendv.b / 255.f, blendv.a / 255.0f, blend);
		}
	}

	// This mostly duplicates the code in shared_sbar.cpp
	// When I was writing this the original was called too late so that I
	// couldn't get the blend in time. However, since then I made some changes
	// here that would get lost if I switched back so I won't do it.

	if (player)
	{
		V_AddPlayerBlend(player, blend, 0.5, 175);
	}
	
	if (players[consoleplayer].camera != NULL)
	{
		// except for fadeto effects
		player_t *player = (players[consoleplayer].camera->player != NULL) ? players[consoleplayer].camera->player : &players[consoleplayer];
		V_AddBlend (player->BlendR, player->BlendG, player->BlendB, player->BlendA, blend);
	}

	gl_RenderState.BlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
	if (blend[3]>0.0f)
	{
		gl_RenderState.SetColor(blend[0], blend[1], blend[2], blend[3]);
		gl_FillScreen();
	}
	gl_RenderState.ResetColor();
	gl_RenderState.EnableTexture(true);
}